

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O2

ostream * std::operator<<(ostream *os,vector<float,_std::allocator<float>_> *vec)

{
  float *pfVar1;
  ostream *poVar2;
  float *item;
  float *pfVar3;
  
  pfVar1 = (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pfVar3 = (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start; pfVar3 != pfVar1; pfVar3 = pfVar3 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(os,*pfVar3);
    std::operator<<(poVar2,", ");
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const std::vector<T>& vec)
{
  for (auto const& item : vec)
  {
    os << item << ", ";
  }
  return os;
}